

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::ConfidentialTxIn::SetIssuance
          (ConfidentialTxIn *this,ByteData256 *blinding_nonce,ByteData256 *asset_entropy,
          ConfidentialValue *issuance_amount,ConfidentialValue *inflation_keys,
          ByteData *issuance_amount_rangeproof,ByteData *inflation_keys_rangeproof)

{
  ByteData *issuance_amount_rangeproof_local;
  ConfidentialValue *inflation_keys_local;
  ConfidentialValue *issuance_amount_local;
  ByteData256 *asset_entropy_local;
  ByteData256 *blinding_nonce_local;
  ConfidentialTxIn *this_local;
  
  ByteData256::operator=(&this->blinding_nonce_,blinding_nonce);
  ByteData256::operator=(&this->asset_entropy_,asset_entropy);
  ConfidentialValue::operator=(&this->issuance_amount_,issuance_amount);
  ConfidentialValue::operator=(&this->inflation_keys_,inflation_keys);
  ByteData::operator=(&this->issuance_amount_rangeproof_,issuance_amount_rangeproof);
  ByteData::operator=(&this->inflation_keys_rangeproof_,inflation_keys_rangeproof);
  return;
}

Assistant:

void ConfidentialTxIn::SetIssuance(
    const ByteData256 &blinding_nonce, const ByteData256 &asset_entropy,
    const ConfidentialValue &issuance_amount,
    const ConfidentialValue &inflation_keys,
    const ByteData &issuance_amount_rangeproof,
    const ByteData &inflation_keys_rangeproof) {
  blinding_nonce_ = blinding_nonce;
  asset_entropy_ = asset_entropy;
  issuance_amount_ = issuance_amount;
  inflation_keys_ = inflation_keys;
  issuance_amount_rangeproof_ = issuance_amount_rangeproof;
  inflation_keys_rangeproof_ = inflation_keys_rangeproof;
}